

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O1

void __thiscall
chaiscript::exception::arithmetic_error::arithmetic_error(arithmetic_error *this,string *reason)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,"Arithmetic error: ",reason);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  *(undefined ***)this = &PTR__runtime_error_0023acc8;
  return;
}

Assistant:

explicit arithmetic_error(const std::string &reason)
        : std::runtime_error("Arithmetic error: " + reason) {
    }